

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joystick.hpp
# Opt level: O2

void __thiscall Inputs::ConcreteJoystick::set_input(ConcreteJoystick *this,Input *input,float value)

{
  Type TVar1;
  undefined4 local_28 [2];
  Info local_20;
  
  TVar1 = input->type;
  if ((int)TVar1 < 6) {
    if ((this->stick_types_).
        super__Vector_base<Inputs::ConcreteJoystick::StickType,_std::allocator<Inputs::ConcreteJoystick::StickType>_>
        ._M_impl.super__Vector_impl_data._M_start[(long)input->info] == Analogue) {
      (*(this->super_Joystick)._vptr_Joystick[7])(this,input);
      return;
    }
  }
  if (TVar1 == Horizontal) {
    local_20 = input->info;
    local_28[0] = 2;
    (*(this->super_Joystick)._vptr_Joystick[8])(this,local_28,(ulong)(value <= 0.25));
    local_20 = input->info;
    local_28[0] = 3;
  }
  else {
    if (TVar1 != Vertical) {
      (*(this->super_Joystick)._vptr_Joystick[8])(this,input,(ulong)(0.5 < value));
      return;
    }
    local_20 = input->info;
    local_28[0] = 0;
    (*(this->super_Joystick)._vptr_Joystick[8])(this,local_28,(ulong)(value <= 0.25));
    local_20 = input->info;
    local_28[0] = 1;
  }
  (*(this->super_Joystick)._vptr_Joystick[8])(this,local_28,(ulong)(0.75 <= value));
  return;
}

Assistant:

void set_input(const Input &input, float value) final {
			// If this is an analogue setting to an analogue property, just pass it along.
			if(!input.is_button() && stick_types_[input.info.control.index] == StickType::Analogue) {
				did_set_input(input, value);
				return;
			}

			// Otherwise apply a threshold test to convert to digital, with remapping from axes to digital inputs.
			using Type = Joystick::Input::Type;
			switch(input.type) {
				default:			did_set_input(input, value > 0.5f);											break;
				case Type::Horizontal:
					did_set_input(Input(Type::Left, input.info.control.index), value <= 0.25f);
					did_set_input(Input(Type::Right, input.info.control.index), value >= 0.75f);
				break;
				case Type::Vertical:
					did_set_input(Input(Type::Up, input.info.control.index), value <= 0.25f);
					did_set_input(Input(Type::Down, input.info.control.index), value >= 0.75f);
				break;
			}
		}